

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Era(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pAig;
  bool bVar1;
  int iVar2;
  uint nStatesMax;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint local_48;
  uint local_44;
  uint local_40;
  
  local_44 = 0;
  Extra_UtilGetoptReset();
  nStatesMax = 1000000000;
  bVar1 = true;
  local_40 = 0;
  local_48 = 0;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Smcdvh"), iVar3 = globalUtilOptind, iVar2 != 0x53) {
      if (iVar2 < 100) {
        if (iVar2 == -1) {
          pAig = pAbc->pGia;
          if (pAig == (Gia_Man_t *)0x0) {
            pcVar4 = "Abc_CommandAbc9Era(): There is no AIG.\n";
          }
          else {
            if (pAig->nRegs != 0) {
              if (bVar1) {
                if (local_40 == 0) {
                  iVar3 = Gia_ManArePerform(pAig,nStatesMax,local_48,local_44);
                  goto LAB_00287ed3;
                }
              }
              else if (0xc < pAig->vCis->nSize - pAig->nRegs) {
                Abc_Print(-1,
                          "Abc_CommandAbc9Era(): The number of PIs (%d) should be no more than 12 when cubes are not used.\n"
                         );
                return 1;
              }
              iVar3 = Gia_ManCollectReachable(pAig,nStatesMax,local_48,local_40,local_44);
LAB_00287ed3:
              pAbc->Status = iVar3;
              Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9Era(): The network is combinational.\n";
          }
          iVar3 = -1;
          goto LAB_00287e6a;
        }
        if (iVar2 != 99) goto LAB_00287d99;
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else if (iVar2 == 100) {
        local_40 = local_40 ^ 1;
      }
      else if (iVar2 == 0x6d) {
        local_48 = local_48 ^ 1;
      }
      else {
        if (iVar2 != 0x76) goto LAB_00287d99;
        local_44 = local_44 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-S\" should be followed by a positive integer.\n");
      goto LAB_00287d99;
    }
    nStatesMax = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)nStatesMax < 0) {
LAB_00287d99:
      Abc_Print(-2,"usage: &era [-S num] [-mcdvh]\n");
      Abc_Print(-2,"\t          explicit reachability analysis for small sequential AIGs\n");
      Abc_Print(-2,"\t-S num  : the max number of states (num > 0) [default = %d]\n",
                (ulong)nStatesMax);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_48 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-m      : stop when the miter output is 1 [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c      : use state cubes instead of state minterms [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_40 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d      : toggle dumping STG into a file [default = %s]\n",pcVar4);
      if (local_44 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v      : print verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h      : print the command usage\n";
      iVar3 = -2;
LAB_00287e6a:
      Abc_Print(iVar3,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Era( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Gia_Man_t * pTemp = NULL;
    int c, fVerbose = 0;
    int fUseCubes = 1;
    int fDumpFile = 0;
    int fMiter = 0;
    int nStatesMax = 1000000000;
    extern int Gia_ManCollectReachable( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fDumpFile, int fVerbose );
    extern int Gia_ManArePerform( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fVerbose );

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Smcdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nStatesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStatesMax < 0 )
                goto usage;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'c':
            fUseCubes ^= 1;
            break;
        case 'd':
            fDumpFile ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Era(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Era(): The network is combinational.\n" );
        return 1;
    }
    if ( !fUseCubes && Gia_ManPiNum(pAbc->pGia) > 12 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Era(): The number of PIs (%d) should be no more than 12 when cubes are not used.\n", Gia_ManPiNum(pAbc->pGia) );
        return 1;
    }
    if ( fUseCubes && !fDumpFile )
        pAbc->Status = Gia_ManArePerform( pAbc->pGia, nStatesMax, fMiter, fVerbose );
    else
        pAbc->Status = Gia_ManCollectReachable( pAbc->pGia, nStatesMax, fMiter, fDumpFile, fVerbose );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &era [-S num] [-mcdvh]\n" );
    Abc_Print( -2, "\t          explicit reachability analysis for small sequential AIGs\n" );
    Abc_Print( -2, "\t-S num  : the max number of states (num > 0) [default = %d]\n", nStatesMax );
    Abc_Print( -2, "\t-m      : stop when the miter output is 1 [default = %s]\n", fMiter? "yes": "no" );
    Abc_Print( -2, "\t-c      : use state cubes instead of state minterms [default = %s]\n", fUseCubes? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle dumping STG into a file [default = %s]\n", fDumpFile? "yes": "no" );
    Abc_Print( -2, "\t-v      : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}